

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O3

void __thiscall write_point_le::operator()(write_point_le *this,way_point_le *point,xr_writer *w)

{
  float local_1c;
  
  local_1c = (point->super_way_point).position.field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (point->super_way_point).position.field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (point->super_way_point).position.field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(point->super_way_point).flags;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)CONCAT22(local_1c._2_2_,point->id);
  (*w->_vptr_xr_writer[2])(w,&local_1c,2);
  xray_re::xr_writer::w_sz(w,(string *)point);
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_writer& w) const {
	w.w_fvector3(point.position);
	w.w_u32(point.flags);
	w.w_u16(point.id);
	w.w_sz(point.name);
}